

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::ProfilingModeSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  ClientConfig *pCVar1;
  char *val;
  LogicalType LStack_28;
  
  pCVar1 = ClientConfig::GetConfig(context);
  if (pCVar1->enable_profiler == false) {
    LogicalType::LogicalType(&LStack_28,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_28);
    LogicalType::~LogicalType(&LStack_28);
  }
  else {
    val = "standard";
    if (pCVar1->enable_detailed_profiling != false) {
      val = "detailed";
    }
    Value::Value(__return_storage_ptr__,val);
  }
  return __return_storage_ptr__;
}

Assistant:

Value ProfilingModeSetting::GetSetting(const ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);
	if (!config.enable_profiler) {
		return Value();
	}
	return Value(config.enable_detailed_profiling ? "detailed" : "standard");
}